

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_show_all_books_in_churches.hpp
# Opt level: O2

void __thiscall
PatchShowAllBooksInChurches::inject_code(PatchShowAllBooksInChurches *this,ROM *rom,World *world)

{
  uint32_t address;
  Code *pCVar1;
  pointer puVar2;
  initializer_list<unsigned_short> __l;
  Param local_150;
  undefined1 local_148;
  vector<unsigned_short,_std::allocator<unsigned_short>_> maps_to_check;
  undefined1 local_128 [32];
  _Rb_tree_node_base local_108;
  size_t local_e8;
  _Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  _Stack_e0;
  Code func;
  
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x265025f025501a5;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x2ed02e002d102bb;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT44(func._bytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_,0x1880131);
  __l._M_len = 10;
  __l._M_array = (iterator)&func;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&maps_to_check,__l,(allocator_type *)local_128);
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &func._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_128._0_8_ = &PTR_getXn_00246ce8;
  local_128._8_8_ = (pointer)0x200ff1204;
  local_148 = 2;
  local_150._vptr_Param = (_func_int **)&PTR_getXn_00246bf0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  md::Code::movew(&func,(Param *)local_128,&local_150);
  for (puVar2 = maps_to_check.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar2 != maps_to_check.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_finish; puVar2 = puVar2 + 1) {
    local_128[8] = 2;
    local_128._0_8_ = &PTR_getXn_00246bf0;
    md::Code::cmpiw(&func,*puVar2,(Param *)local_128);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_128,"special_map",(allocator<char> *)&local_150);
    md::Code::beq(&func,(string *)local_128);
    std::__cxx11::string::~string((string *)local_128);
  }
  local_128[8] = 2;
  local_128._0_8_ = &PTR_getXn_00246bf0;
  md::Code::clrw(&func,(Param *)local_128);
  md::Code::jmp(&func,0x1969a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,"special_map",(allocator<char> *)&local_150);
  md::Code::label(&func,(string *)local_128);
  std::__cxx11::string::~string((string *)local_128);
  local_128[8] = 2;
  local_128._0_8_ = &PTR_getXn_00246bf0;
  md::Code::clrw(&func,(Param *)local_128);
  md::Code::jmp(&func,0x196bc);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,"",(allocator<char> *)&local_150);
  address = md::ROM::inject_code(rom,&func,(string *)local_128);
  std::__cxx11::string::~string((string *)local_128);
  local_108._M_left = &local_108;
  _Stack_e0.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_e8 = 0;
  _Stack_e0._0_8_ = 0;
  local_108._M_color = _S_red;
  local_108._4_4_ = 0;
  local_108._M_parent = (_Base_ptr)0x0;
  local_128._16_8_ = 0;
  local_128._24_8_ = 0;
  local_128._0_8_ = (_func_int **)0x0;
  local_128._8_8_ = (pointer)0x0;
  _Stack_e0.super__Rb_tree_header._M_header._M_left = &_Stack_e0.super__Rb_tree_header._M_header;
  _Stack_e0.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_e0.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_e0.super__Rb_tree_header._M_node_count = 0;
  local_108._M_right = local_108._M_left;
  _Stack_e0.super__Rb_tree_header._M_header._M_right =
       _Stack_e0.super__Rb_tree_header._M_header._M_left;
  pCVar1 = md::Code::jmp((Code *)local_128,address);
  pCVar1 = md::Code::nop(pCVar1,3);
  md::ROM::set_code(rom,0x1968e,pCVar1);
  md::Code::~Code((Code *)local_128);
  md::Code::~Code(&func);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&maps_to_check.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  return;
}

Assistant:

void inject_code(md::ROM& rom, World& world) override
    {
        std::vector<uint16_t> maps_to_check = {
                MAP_STAIRWAY_TO_NOLE,
                MAP_MASSAN_CHURCH, MAP_GUMI_CHURCH, MAP_RYUMA_CHURCH, MAP_MERCATOR_CHURCH,
                MAP_VERLA_CHURCH, MAP_DESTEL_CHURCH, MAP_KAZALT_CHURCH,
                MAP_LAKE_SHRINE_SAVE_ROOM, MAP_KN_LABYRINTH_SAVE_ROOM
        };

        constexpr uint32_t JUMP_ADDR_SKIP_ITEM_REMOVAL = 0x196BC;
        constexpr uint32_t JUMP_ADDR_DO_ITEM_REMOVAL = 0x1969A;

        md::Code func;
        func.movew(addr_(0xFF1204), reg_D2);
        for(uint16_t map_id : maps_to_check)
        {
            func.cmpiw(map_id, reg_D2);
            func.beq("special_map");
        }
        func.clrw(reg_D2);
        func.jmp(JUMP_ADDR_DO_ITEM_REMOVAL); // Regular map, do the item removal as usual

        func.label("special_map");
        func.clrw(reg_D2);
        func.jmp(JUMP_ADDR_SKIP_ITEM_REMOVAL); // Special map, do not perform the item removal

        uint32_t func_addr = rom.inject_code(func);
        rom.set_code(0x1968E, md::Code().jmp(func_addr).nop(3));
    }